

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O0

void __thiscall IDisk::IDisk(IDisk *this,DiskType diskType)

{
  MFMTrack *pMVar1;
  uchar *puVar2;
  uint local_28;
  uint track;
  DiskType diskType_local;
  IDisk *this_local;
  
  IDisk(this);
  this->nb_sides_ = '\x01';
  this->side_[0].nb_tracks = 0x2a;
  pMVar1 = (MFMTrack *)operator_new__((ulong)this->side_[0].nb_tracks << 5);
  this->side_[0].tracks = pMVar1;
  for (local_28 = 0; local_28 < this->side_[0].nb_tracks; local_28 = local_28 + 1) {
    this->side_[0].tracks[local_28].nb_revolutions = 0;
    this->side_[0].tracks[local_28].revolution = (Revolution *)0x0;
    this->side_[0].tracks[local_28].size = 100000;
    puVar2 = (uchar *)operator_new__((ulong)this->side_[0].tracks[local_28].size);
    this->side_[0].tracks[local_28].bitfield = puVar2;
    pMVar1 = this->side_[0].tracks;
    FillTrack(pMVar1[local_28].bitfield,(uchar)local_28,diskType,pMVar1[local_28].size);
  }
  return;
}

Assistant:

IDisk::IDisk(IDisk::DiskType diskType) : IDisk()
{
   // BLANK DISK :
   // One side
   nb_sides_ = 1;

   // 41 tracks
   side_[0].nb_tracks = 42;
   side_[0].tracks = new MFMTrack[side_[0].nb_tracks];
   for (unsigned int track = 0; track < side_[0].nb_tracks; track++)
   {
      // One revolution
      side_[0].tracks[track].nb_revolutions = 0;
      side_[0].tracks[track].revolution = nullptr; //new tRevolution[1];

      side_[0].tracks[track].size = 6250 * 16;
      side_[0].tracks[track].bitfield = new unsigned char[side_[0].tracks[track].size];

      // Fill each track
      FillTrack(side_[0].tracks[track].bitfield, track, diskType, side_[0].tracks[track].size);
   }
}